

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

void __thiscall ON_SubDComponentList::UpdateContentSerialNumbers(ON_SubDComponentList *this)

{
  ON_SubDimple *pOVar1;
  ON__UINT64 OVar2;
  
  pOVar1 = (this->m_subd).m_subdimple_sp.
           super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pOVar1 == (ON_SubDimple *)0x0) {
    OVar2 = 0;
  }
  else {
    OVar2 = ON_SubDimple::GeometryContentSerialNumber(pOVar1);
  }
  this->m_subd_geometry_content_serial_number = OVar2;
  pOVar1 = (this->m_subd).m_subdimple_sp.
           super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pOVar1 == (ON_SubDimple *)0x0) {
    OVar2 = 0;
  }
  else {
    OVar2 = ON_SubDimple::RenderContentSerialNumber(pOVar1);
  }
  this->m_subd_render_content_serial_number = OVar2;
  return;
}

Assistant:

void ON_SubDComponentList::UpdateContentSerialNumbers()
{
  m_subd_geometry_content_serial_number = m_subd.GeometryContentSerialNumber();
  m_subd_render_content_serial_number = m_subd.RenderContentSerialNumber();
}